

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx2_blend_popcnt_unroll4(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ulong uVar1;
  int *piVar2;
  ushort uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  byte bVar128;
  byte bVar129;
  byte bVar130;
  byte bVar131;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  long lVar134;
  ulong uVar135;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  
  auVar133 = _DAT_001202e0;
  auVar132 = _DAT_001202c0;
  uVar135 = 0;
  while (uVar1 = uVar135 + 4, uVar1 <= len >> 4) {
    lVar134 = 0x20;
    auVar136 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar135 * 0x10),auVar132,
                                 *(undefined1 (*) [32])(array + uVar135 * 0x10 + 0x10));
    auVar137 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar135 * 0x10 + 0x10),auVar133,
                                 *(undefined1 (*) [32])(array + uVar135 * 0x10));
    auVar138 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar135 * 0x10 + 0x20),auVar132,
                                 *(undefined1 (*) [32])(array + uVar135 * 0x10 + 0x30));
    auVar139 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar135 * 0x10 + 0x30),auVar133,
                                 *(undefined1 (*) [32])(array + uVar135 * 0x10 + 0x20));
    for (; uVar135 = uVar1, lVar134 != 0; lVar134 = lVar134 + -4) {
      auVar4 = auVar136 >> 7;
      auVar8 = auVar136 >> 0xf;
      auVar12 = auVar136 >> 0x17;
      auVar16 = auVar136 >> 0x1f;
      auVar20 = auVar136 >> 0x27;
      auVar24 = auVar136 >> 0x2f;
      auVar28 = auVar136 >> 0x37;
      auVar32 = auVar136 >> 0x3f;
      auVar36 = auVar136 >> 0x47;
      auVar40 = auVar136 >> 0x4f;
      auVar44 = auVar136 >> 0x57;
      auVar48 = auVar136 >> 0x5f;
      auVar52 = auVar136 >> 0x67;
      auVar56 = auVar136 >> 0x6f;
      auVar60 = auVar136 >> 0x77;
      auVar64 = auVar136 >> 0x7f;
      auVar68 = auVar136 >> 0x87;
      auVar72 = auVar136 >> 0x8f;
      auVar76 = auVar136 >> 0x97;
      auVar80 = auVar136 >> 0x9f;
      auVar84 = auVar136 >> 0xa7;
      auVar88 = auVar136 >> 0xaf;
      auVar92 = auVar136 >> 0xb7;
      auVar96 = auVar136 >> 0xbf;
      auVar100 = auVar136 >> 199;
      auVar104 = auVar136 >> 0xcf;
      auVar108 = auVar136 >> 0xd7;
      auVar112 = auVar136 >> 0xdf;
      auVar116 = auVar136 >> 0xe7;
      auVar120 = auVar136 >> 0xef;
      auVar124 = auVar136 >> 0xf7;
      bVar128 = auVar136[0x1f];
      auVar5 = auVar137 >> 7;
      auVar9 = auVar137 >> 0xf;
      auVar13 = auVar137 >> 0x17;
      auVar17 = auVar137 >> 0x1f;
      auVar21 = auVar137 >> 0x27;
      auVar25 = auVar137 >> 0x2f;
      auVar29 = auVar137 >> 0x37;
      auVar33 = auVar137 >> 0x3f;
      auVar37 = auVar137 >> 0x47;
      auVar41 = auVar137 >> 0x4f;
      auVar45 = auVar137 >> 0x57;
      auVar49 = auVar137 >> 0x5f;
      auVar53 = auVar137 >> 0x67;
      auVar57 = auVar137 >> 0x6f;
      auVar61 = auVar137 >> 0x77;
      auVar65 = auVar137 >> 0x7f;
      auVar69 = auVar137 >> 0x87;
      auVar73 = auVar137 >> 0x8f;
      auVar77 = auVar137 >> 0x97;
      auVar81 = auVar137 >> 0x9f;
      auVar85 = auVar137 >> 0xa7;
      auVar89 = auVar137 >> 0xaf;
      auVar93 = auVar137 >> 0xb7;
      auVar97 = auVar137 >> 0xbf;
      auVar101 = auVar137 >> 199;
      auVar105 = auVar137 >> 0xcf;
      auVar109 = auVar137 >> 0xd7;
      auVar113 = auVar137 >> 0xdf;
      auVar117 = auVar137 >> 0xe7;
      auVar121 = auVar137 >> 0xef;
      auVar125 = auVar137 >> 0xf7;
      bVar129 = auVar137[0x1f];
      auVar6 = auVar138 >> 7;
      auVar10 = auVar138 >> 0xf;
      auVar14 = auVar138 >> 0x17;
      auVar18 = auVar138 >> 0x1f;
      auVar22 = auVar138 >> 0x27;
      auVar26 = auVar138 >> 0x2f;
      auVar30 = auVar138 >> 0x37;
      auVar34 = auVar138 >> 0x3f;
      auVar38 = auVar138 >> 0x47;
      auVar42 = auVar138 >> 0x4f;
      auVar46 = auVar138 >> 0x57;
      auVar50 = auVar138 >> 0x5f;
      auVar54 = auVar138 >> 0x67;
      auVar58 = auVar138 >> 0x6f;
      auVar62 = auVar138 >> 0x77;
      auVar66 = auVar138 >> 0x7f;
      auVar70 = auVar138 >> 0x87;
      auVar74 = auVar138 >> 0x8f;
      auVar78 = auVar138 >> 0x97;
      auVar82 = auVar138 >> 0x9f;
      auVar86 = auVar138 >> 0xa7;
      auVar90 = auVar138 >> 0xaf;
      auVar94 = auVar138 >> 0xb7;
      auVar98 = auVar138 >> 0xbf;
      auVar102 = auVar138 >> 199;
      auVar106 = auVar138 >> 0xcf;
      auVar110 = auVar138 >> 0xd7;
      auVar114 = auVar138 >> 0xdf;
      auVar118 = auVar138 >> 0xe7;
      auVar122 = auVar138 >> 0xef;
      auVar126 = auVar138 >> 0xf7;
      bVar130 = auVar138[0x1f];
      auVar136 = vpaddb_avx2(auVar136,auVar136);
      auVar137 = vpaddb_avx2(auVar137,auVar137);
      auVar138 = vpaddb_avx2(auVar138,auVar138);
      auVar7 = auVar139 >> 7;
      auVar11 = auVar139 >> 0xf;
      auVar15 = auVar139 >> 0x17;
      auVar19 = auVar139 >> 0x1f;
      auVar23 = auVar139 >> 0x27;
      auVar27 = auVar139 >> 0x2f;
      auVar31 = auVar139 >> 0x37;
      auVar35 = auVar139 >> 0x3f;
      auVar39 = auVar139 >> 0x47;
      auVar43 = auVar139 >> 0x4f;
      auVar47 = auVar139 >> 0x57;
      auVar51 = auVar139 >> 0x5f;
      auVar55 = auVar139 >> 0x67;
      auVar59 = auVar139 >> 0x6f;
      auVar63 = auVar139 >> 0x77;
      auVar67 = auVar139 >> 0x7f;
      auVar71 = auVar139 >> 0x87;
      auVar75 = auVar139 >> 0x8f;
      auVar79 = auVar139 >> 0x97;
      auVar83 = auVar139 >> 0x9f;
      auVar87 = auVar139 >> 0xa7;
      auVar91 = auVar139 >> 0xaf;
      auVar95 = auVar139 >> 0xb7;
      auVar99 = auVar139 >> 0xbf;
      auVar103 = auVar139 >> 199;
      auVar107 = auVar139 >> 0xcf;
      auVar111 = auVar139 >> 0xd7;
      auVar115 = auVar139 >> 0xdf;
      auVar119 = auVar139 >> 0xe7;
      auVar123 = auVar139 >> 0xef;
      auVar127 = auVar139 >> 0xf7;
      bVar131 = auVar139[0x1f];
      auVar139 = vpaddb_avx2(auVar139,auVar139);
      *(int *)((long)flags + lVar134 + -4) =
           POPCOUNT((uint)(auVar6[0] & 1) | (uint)(auVar10[0] & 1) << 1 |
                    (uint)(auVar14[0] & 1) << 2 | (uint)(auVar18[0] & 1) << 3 |
                    (uint)(auVar22[0] & 1) << 4 | (uint)(auVar26[0] & 1) << 5 |
                    (uint)(auVar30[0] & 1) << 6 | (uint)(auVar34[0] & 1) << 7 |
                    (uint)(auVar38[0] & 1) << 8 | (uint)(auVar42[0] & 1) << 9 |
                    (uint)(auVar46[0] & 1) << 10 | (uint)(auVar50[0] & 1) << 0xb |
                    (uint)(auVar54[0] & 1) << 0xc | (uint)(auVar58[0] & 1) << 0xd |
                    (uint)(auVar62[0] & 1) << 0xe | (uint)auVar66[0] << 0xf |
                    (uint)(auVar70[0] & 1) << 0x10 | (uint)(auVar74[0] & 1) << 0x11 |
                    (uint)(auVar78[0] & 1) << 0x12 | (uint)(auVar82[0] & 1) << 0x13 |
                    (uint)(auVar86[0] & 1) << 0x14 | (uint)(auVar90[0] & 1) << 0x15 |
                    (uint)(auVar94[0] & 1) << 0x16 | (uint)auVar98[0] << 0x17 |
                    (uint)(auVar102[0] & 1) << 0x18 | (uint)(auVar106[0] & 1) << 0x19 |
                    (uint)(auVar110[0] & 1) << 0x1a | (uint)(auVar114[0] & 1) << 0x1b |
                    (uint)(auVar118[0] & 1) << 0x1c | (uint)(auVar122[0] & 1) << 0x1d |
                    (uint)(auVar126[0] & 1) << 0x1e | (uint)(bVar130 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar4[0] & 1) | (uint)(auVar8[0] & 1) << 1 | (uint)(auVar12[0] & 1) << 2
                    | (uint)(auVar16[0] & 1) << 3 | (uint)(auVar20[0] & 1) << 4 |
                    (uint)(auVar24[0] & 1) << 5 | (uint)(auVar28[0] & 1) << 6 |
                    (uint)(auVar32[0] & 1) << 7 | (uint)(auVar36[0] & 1) << 8 |
                    (uint)(auVar40[0] & 1) << 9 | (uint)(auVar44[0] & 1) << 10 |
                    (uint)(auVar48[0] & 1) << 0xb | (uint)(auVar52[0] & 1) << 0xc |
                    (uint)(auVar56[0] & 1) << 0xd | (uint)(auVar60[0] & 1) << 0xe |
                    (uint)auVar64[0] << 0xf | (uint)(auVar68[0] & 1) << 0x10 |
                    (uint)(auVar72[0] & 1) << 0x11 | (uint)(auVar76[0] & 1) << 0x12 |
                    (uint)(auVar80[0] & 1) << 0x13 | (uint)(auVar84[0] & 1) << 0x14 |
                    (uint)(auVar88[0] & 1) << 0x15 | (uint)(auVar92[0] & 1) << 0x16 |
                    (uint)auVar96[0] << 0x17 | (uint)(auVar100[0] & 1) << 0x18 |
                    (uint)(auVar104[0] & 1) << 0x19 | (uint)(auVar108[0] & 1) << 0x1a |
                    (uint)(auVar112[0] & 1) << 0x1b | (uint)(auVar116[0] & 1) << 0x1c |
                    (uint)(auVar120[0] & 1) << 0x1d | (uint)(auVar124[0] & 1) << 0x1e |
                    (uint)(bVar128 >> 7) << 0x1f) + *(int *)((long)flags + lVar134 + -4);
      *(int *)((long)flags + lVar134 + 0x1c) =
           POPCOUNT((uint)(auVar7[0] & 1) | (uint)(auVar11[0] & 1) << 1 |
                    (uint)(auVar15[0] & 1) << 2 | (uint)(auVar19[0] & 1) << 3 |
                    (uint)(auVar23[0] & 1) << 4 | (uint)(auVar27[0] & 1) << 5 |
                    (uint)(auVar31[0] & 1) << 6 | (uint)(auVar35[0] & 1) << 7 |
                    (uint)(auVar39[0] & 1) << 8 | (uint)(auVar43[0] & 1) << 9 |
                    (uint)(auVar47[0] & 1) << 10 | (uint)(auVar51[0] & 1) << 0xb |
                    (uint)(auVar55[0] & 1) << 0xc | (uint)(auVar59[0] & 1) << 0xd |
                    (uint)(auVar63[0] & 1) << 0xe | (uint)auVar67[0] << 0xf |
                    (uint)(auVar71[0] & 1) << 0x10 | (uint)(auVar75[0] & 1) << 0x11 |
                    (uint)(auVar79[0] & 1) << 0x12 | (uint)(auVar83[0] & 1) << 0x13 |
                    (uint)(auVar87[0] & 1) << 0x14 | (uint)(auVar91[0] & 1) << 0x15 |
                    (uint)(auVar95[0] & 1) << 0x16 | (uint)auVar99[0] << 0x17 |
                    (uint)(auVar103[0] & 1) << 0x18 | (uint)(auVar107[0] & 1) << 0x19 |
                    (uint)(auVar111[0] & 1) << 0x1a | (uint)(auVar115[0] & 1) << 0x1b |
                    (uint)(auVar119[0] & 1) << 0x1c | (uint)(auVar123[0] & 1) << 0x1d |
                    (uint)(auVar127[0] & 1) << 0x1e | (uint)(bVar131 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar5[0] & 1) | (uint)(auVar9[0] & 1) << 1 | (uint)(auVar13[0] & 1) << 2
                    | (uint)(auVar17[0] & 1) << 3 | (uint)(auVar21[0] & 1) << 4 |
                    (uint)(auVar25[0] & 1) << 5 | (uint)(auVar29[0] & 1) << 6 |
                    (uint)(auVar33[0] & 1) << 7 | (uint)(auVar37[0] & 1) << 8 |
                    (uint)(auVar41[0] & 1) << 9 | (uint)(auVar45[0] & 1) << 10 |
                    (uint)(auVar49[0] & 1) << 0xb | (uint)(auVar53[0] & 1) << 0xc |
                    (uint)(auVar57[0] & 1) << 0xd | (uint)(auVar61[0] & 1) << 0xe |
                    (uint)auVar65[0] << 0xf | (uint)(auVar69[0] & 1) << 0x10 |
                    (uint)(auVar73[0] & 1) << 0x11 | (uint)(auVar77[0] & 1) << 0x12 |
                    (uint)(auVar81[0] & 1) << 0x13 | (uint)(auVar85[0] & 1) << 0x14 |
                    (uint)(auVar89[0] & 1) << 0x15 | (uint)(auVar93[0] & 1) << 0x16 |
                    (uint)auVar97[0] << 0x17 | (uint)(auVar101[0] & 1) << 0x18 |
                    (uint)(auVar105[0] & 1) << 0x19 | (uint)(auVar109[0] & 1) << 0x1a |
                    (uint)(auVar113[0] & 1) << 0x1b | (uint)(auVar117[0] & 1) << 0x1c |
                    (uint)(auVar121[0] & 1) << 0x1d | (uint)(auVar125[0] & 1) << 0x1e |
                    (uint)(bVar129 >> 7) << 0x1f) + *(int *)((long)flags + lVar134 + 0x1c);
    }
  }
  while (uVar1 = uVar135 + 2, uVar1 <= len >> 4) {
    lVar134 = 0x20;
    auVar136 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar135 * 0x10),auVar132,
                                 *(undefined1 (*) [32])(array + uVar135 * 0x10 + 0x10));
    auVar137 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar135 * 0x10 + 0x10),auVar133,
                                 *(undefined1 (*) [32])(array + uVar135 * 0x10));
    for (; uVar135 = uVar1, lVar134 != 0; lVar134 = lVar134 + -4) {
      auVar138 = auVar136 >> 7;
      auVar139 = auVar136 >> 0xf;
      auVar4 = auVar136 >> 0x17;
      auVar5 = auVar136 >> 0x1f;
      auVar6 = auVar136 >> 0x27;
      auVar7 = auVar136 >> 0x2f;
      auVar8 = auVar136 >> 0x37;
      auVar9 = auVar136 >> 0x3f;
      auVar10 = auVar136 >> 0x47;
      auVar11 = auVar136 >> 0x4f;
      auVar12 = auVar136 >> 0x57;
      auVar13 = auVar136 >> 0x5f;
      auVar14 = auVar136 >> 0x67;
      auVar15 = auVar136 >> 0x6f;
      auVar16 = auVar136 >> 0x77;
      auVar17 = auVar136 >> 0x7f;
      auVar18 = auVar136 >> 0x87;
      auVar19 = auVar136 >> 0x8f;
      auVar20 = auVar136 >> 0x97;
      auVar21 = auVar136 >> 0x9f;
      auVar22 = auVar136 >> 0xa7;
      auVar23 = auVar136 >> 0xaf;
      auVar24 = auVar136 >> 0xb7;
      auVar25 = auVar136 >> 0xbf;
      auVar26 = auVar136 >> 199;
      auVar27 = auVar136 >> 0xcf;
      auVar28 = auVar136 >> 0xd7;
      auVar29 = auVar136 >> 0xdf;
      auVar30 = auVar136 >> 0xe7;
      auVar31 = auVar136 >> 0xef;
      auVar32 = auVar136 >> 0xf7;
      bVar128 = auVar136[0x1f];
      auVar136 = vpaddb_avx2(auVar136,auVar136);
      piVar2 = (int *)((long)flags + lVar134 + -4);
      *piVar2 = *piVar2 + POPCOUNT((uint)(auVar138[0] & 1) | (uint)(auVar139[0] & 1) << 1 |
                                   (uint)(auVar4[0] & 1) << 2 | (uint)(auVar5[0] & 1) << 3 |
                                   (uint)(auVar6[0] & 1) << 4 | (uint)(auVar7[0] & 1) << 5 |
                                   (uint)(auVar8[0] & 1) << 6 | (uint)(auVar9[0] & 1) << 7 |
                                   (uint)(auVar10[0] & 1) << 8 | (uint)(auVar11[0] & 1) << 9 |
                                   (uint)(auVar12[0] & 1) << 10 | (uint)(auVar13[0] & 1) << 0xb |
                                   (uint)(auVar14[0] & 1) << 0xc | (uint)(auVar15[0] & 1) << 0xd |
                                   (uint)(auVar16[0] & 1) << 0xe | (uint)auVar17[0] << 0xf |
                                   (uint)(auVar18[0] & 1) << 0x10 | (uint)(auVar19[0] & 1) << 0x11 |
                                   (uint)(auVar20[0] & 1) << 0x12 | (uint)(auVar21[0] & 1) << 0x13 |
                                   (uint)(auVar22[0] & 1) << 0x14 | (uint)(auVar23[0] & 1) << 0x15 |
                                   (uint)(auVar24[0] & 1) << 0x16 | (uint)auVar25[0] << 0x17 |
                                   (uint)(auVar26[0] & 1) << 0x18 | (uint)(auVar27[0] & 1) << 0x19 |
                                   (uint)(auVar28[0] & 1) << 0x1a | (uint)(auVar29[0] & 1) << 0x1b |
                                   (uint)(auVar30[0] & 1) << 0x1c | (uint)(auVar31[0] & 1) << 0x1d |
                                   (uint)(auVar32[0] & 1) << 0x1e | (uint)(bVar128 >> 7) << 0x1f);
      auVar138 = auVar137 >> 7;
      auVar139 = auVar137 >> 0xf;
      auVar4 = auVar137 >> 0x17;
      auVar5 = auVar137 >> 0x1f;
      auVar6 = auVar137 >> 0x27;
      auVar7 = auVar137 >> 0x2f;
      auVar8 = auVar137 >> 0x37;
      auVar9 = auVar137 >> 0x3f;
      auVar10 = auVar137 >> 0x47;
      auVar11 = auVar137 >> 0x4f;
      auVar12 = auVar137 >> 0x57;
      auVar13 = auVar137 >> 0x5f;
      auVar14 = auVar137 >> 0x67;
      auVar15 = auVar137 >> 0x6f;
      auVar16 = auVar137 >> 0x77;
      auVar17 = auVar137 >> 0x7f;
      auVar18 = auVar137 >> 0x87;
      auVar19 = auVar137 >> 0x8f;
      auVar20 = auVar137 >> 0x97;
      auVar21 = auVar137 >> 0x9f;
      auVar22 = auVar137 >> 0xa7;
      auVar23 = auVar137 >> 0xaf;
      auVar24 = auVar137 >> 0xb7;
      auVar25 = auVar137 >> 0xbf;
      auVar26 = auVar137 >> 199;
      auVar27 = auVar137 >> 0xcf;
      auVar28 = auVar137 >> 0xd7;
      auVar29 = auVar137 >> 0xdf;
      auVar30 = auVar137 >> 0xe7;
      auVar31 = auVar137 >> 0xef;
      auVar32 = auVar137 >> 0xf7;
      bVar128 = auVar137[0x1f];
      auVar137 = vpaddb_avx2(auVar137,auVar137);
      piVar2 = (int *)((long)flags + lVar134 + 0x1c);
      *piVar2 = *piVar2 + POPCOUNT((uint)(auVar138[0] & 1) | (uint)(auVar139[0] & 1) << 1 |
                                   (uint)(auVar4[0] & 1) << 2 | (uint)(auVar5[0] & 1) << 3 |
                                   (uint)(auVar6[0] & 1) << 4 | (uint)(auVar7[0] & 1) << 5 |
                                   (uint)(auVar8[0] & 1) << 6 | (uint)(auVar9[0] & 1) << 7 |
                                   (uint)(auVar10[0] & 1) << 8 | (uint)(auVar11[0] & 1) << 9 |
                                   (uint)(auVar12[0] & 1) << 10 | (uint)(auVar13[0] & 1) << 0xb |
                                   (uint)(auVar14[0] & 1) << 0xc | (uint)(auVar15[0] & 1) << 0xd |
                                   (uint)(auVar16[0] & 1) << 0xe | (uint)auVar17[0] << 0xf |
                                   (uint)(auVar18[0] & 1) << 0x10 | (uint)(auVar19[0] & 1) << 0x11 |
                                   (uint)(auVar20[0] & 1) << 0x12 | (uint)(auVar21[0] & 1) << 0x13 |
                                   (uint)(auVar22[0] & 1) << 0x14 | (uint)(auVar23[0] & 1) << 0x15 |
                                   (uint)(auVar24[0] & 1) << 0x16 | (uint)auVar25[0] << 0x17 |
                                   (uint)(auVar26[0] & 1) << 0x18 | (uint)(auVar27[0] & 1) << 0x19 |
                                   (uint)(auVar28[0] & 1) << 0x1a | (uint)(auVar29[0] & 1) << 0x1b |
                                   (uint)(auVar30[0] & 1) << 0x1c | (uint)(auVar31[0] & 1) << 0x1d |
                                   (uint)(auVar32[0] & 1) << 0x1e | (uint)(bVar128 >> 7) << 0x1f);
    }
  }
  for (uVar135 = uVar135 << 4; uVar135 < len; uVar135 = uVar135 + 1) {
    uVar3 = array[uVar135];
    for (lVar134 = 0; lVar134 != 0x10; lVar134 = lVar134 + 1) {
      flags[lVar134] = flags[lVar134] + (uint)((uVar3 >> ((uint)lVar134 & 0x1f) & 1) != 0);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt_unroll4(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 4 <= n_cycles; i += 4) {
#define L(p) __m256i v##p = _mm256_loadu_si256(data_vectors+i+p);
        L(0) L(1) L(2) L(3)
        
#define U0(p,k) __m256i input##p = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v##k, 8));
#define U1(p,k) __m256i input##k = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16((int16_t)0xFF00)), _mm256_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)
       U(0,1) U(2, 3)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3)

#define P0(p) input##p = _mm256_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}